

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

void __thiscall IrSim::optimizeAssign(IrSim *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  pointer piVar4;
  pointer pIVar5;
  __type _Var6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  InterCode *pIVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  string right;
  string val;
  
  this->isOpted = false;
  uVar9 = ((long)(this->edges).
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->edges).
                super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x30;
  uVar10 = uVar9 & 0xffffffff;
  if ((int)uVar9 < 1) {
    uVar10 = 0;
  }
  uVar9 = 0;
  do {
    uVar13 = uVar9;
    if (uVar13 == uVar10) {
      return;
    }
    piVar4 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar4[uVar13 + 1];
    for (lVar14 = (long)piVar4[uVar13]; uVar9 = uVar13 + 1, lVar14 < iVar1; lVar14 = lVar14 + 1) {
      pIVar5 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = pIVar5[lVar14].kind;
      pIVar11 = pIVar5 + lVar14;
      if (iVar2 == 5) {
        uVar3 = (pIVar11->target).active;
        uVar8 = uVar3;
        if (*(pIVar11->target).value._M_dataplus._M_p == 'v') {
          uVar8 = 0xffffffff;
        }
        if (0 < (int)uVar8) {
          std::__cxx11::string::string((string *)&val,(string *)&(pIVar11->target).value);
          std::__cxx11::string::string
                    ((string *)&right,
                     (string *)
                     &(this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar14].arg1.value);
          iVar2 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar14].arg1.kind;
          uVar8 = uVar3;
LAB_00108b35:
          if (0 < (int)uVar8) {
            iVar12 = 3;
            do {
              if (iVar12 == 0) {
                uVar8 = 0xffffffff;
                goto LAB_00108b35;
              }
              lVar15 = 8;
              if (iVar12 == 1) {
                lVar15 = 0x68;
              }
              if (iVar12 == 2) {
                lVar15 = 0x38;
              }
              _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&(this->irList).
                                                 super__Vector_base<InterCode,_std::allocator<InterCode>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                                 target.kind + lVar15),&val);
              iVar12 = iVar12 + -1;
            } while (!_Var6);
            this->isOpted = true;
            std::__cxx11::string::_M_assign
                      ((string *)
                       ((long)&(this->irList).
                               super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar8].target.kind + lVar15));
            pIVar11 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar8;
            *(int *)((long)&pIVar11->kind + lVar15) = iVar2;
            uVar8 = *(uint *)((long)&(pIVar11->target).value.field_2 + lVar15 + 8);
            InterCode::doArith(pIVar11);
            *(undefined4 *)
             ((long)&(this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                     _M_impl.super__Vector_impl_data._M_start[(int)uVar8].target.value.field_2 +
             lVar15 + 8U) = 0;
            goto LAB_00108b35;
          }
          std::__cxx11::string::~string((string *)&right);
          std::__cxx11::string::~string((string *)&val);
        }
        if ((uVar8 == 0) &&
           (bVar7 = canDisable(this,&(this->irList).
                                     super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                                     _M_impl.super__Vector_impl_data._M_start[lVar14].target.value,
                               (int)uVar13), bVar7)) {
          InterCode::disable((this->irList).
                             super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar14);
LAB_00108c64:
          this->isOpted = true;
        }
      }
      else if ((iVar2 - 1U < 5) && (bVar7 = InterCode::doArith(pIVar11), bVar7)) goto LAB_00108c64;
    }
  } while( true );
}

Assistant:

void IrSim::optimizeAssign() {
    isOpted = false;
    int size = (int)edges.size();
    for (int i = 0; i < size; ++i) {
        for (int k = (int) basicBlocks[i], j = (int) basicBlocks[i + 1] - 1; k <= j; ++k) {
            int kind = irList[k].kind;
            if (kind == IC_ASSIGN) {
                int m = irList[k].target.active;
                if (irList[k].target.value[0] == 'v')
                    m = -1;
                if (m > 0) {
                    string val = irList[k].target.value;
                    string right = irList[k].arg1.value;
                    kind = irList[k].arg1.kind;
                    while (m > 0) {
                        int n = 0;
                        for (; n < 3; ++n) {
                            if (irList[m][n].value == val) {
                                isOpted = true;
                                irList[m][n].value = right;
                                irList[m][n].kind = kind;
                                int active = irList[m][n].active;
                                irList[m].doArith();
                                m = active;
                                irList[m][n].active = 0;
                                break;
                            }
                        }
                        if (n == 3) {
//                            cerr << "debug: index val != val (should not happen, ignore optimizing)" << endl;
                            m = -1;
                        }
                    }
                }
//                else if (irList[k].target.active != 0 && irList[k].target.value[0] != 'v') {
//                    cerr << "debug: target < 0 (should not happen, ignore optimizing)" << endl;
//                }
                if (m == 0 && canDisable(irList[k].target.value, i)) {
                    irList[k].disable();
                    isOpted = true;
                }
            }
            else if (kind >= IC_ADD && kind <= IC_ASSIGN) {
                if (irList[k].doArith())
                    isOpted = true;
            }
        }
    }
}